

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_rle.c
# Opt level: O1

uint64_t internal_rle_compress(void *out,uint64_t outbytes,void *src,uint64_t srcbytes)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  
  pcVar4 = (char *)(srcbytes + (long)src);
  uVar3 = 0;
  pcVar5 = (char *)src;
  do {
    if (pcVar4 <= src) {
      return uVar3;
    }
    pcVar5 = pcVar5 + 1;
    if (pcVar5 < pcVar4) {
      uVar6 = 0;
      do {
        if ((*src != pcVar5[uVar6]) || ((char)uVar6 == '\x7f')) break;
        lVar7 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while (pcVar5 + lVar7 < pcVar4);
      pcVar5 = pcVar5 + uVar6;
    }
    else {
      uVar6 = 0;
    }
    bVar10 = (byte)uVar6;
    if (bVar10 < 2) {
      if (pcVar5 < pcVar4) {
        pcVar8 = pcVar5 + 2;
        do {
          bVar10 = (byte)uVar6;
          uVar11 = (int)uVar6 + 1;
          pcVar1 = pcVar8 + -1;
          bVar9 = (byte)uVar11;
          if (((pcVar1 < pcVar4) && (pcVar8[-2] == pcVar8[-1])) && (pcVar8 < pcVar4)) {
            if ((pcVar8[-1] == *pcVar8) || (0x7e < bVar9)) {
              pcVar5 = pcVar8 + -2;
              break;
            }
          }
          else if (0x7e < bVar9) break;
          pcVar5 = pcVar5 + 1;
          pcVar8 = pcVar8 + 1;
          uVar6 = (ulong)uVar11;
          bVar10 = bVar9;
        } while (pcVar1 < pcVar4);
      }
      *(byte *)((long)out + uVar3) = ~bVar10;
      uVar3 = uVar3 + 1;
      if (src < pcVar5) {
        lVar7 = (long)pcVar5 - (long)src;
        do {
          cVar2 = *src;
          src = (void *)((long)src + 1);
          *(char *)((long)out + uVar3) = cVar2;
          uVar3 = uVar3 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
    }
    else {
      *(byte *)((long)out + uVar3) = bVar10;
      *(char *)((long)out + uVar3 + 1) = *src;
      uVar3 = uVar3 + 2;
      src = pcVar5;
    }
    if (outbytes <= uVar3) {
      return uVar3;
    }
  } while( true );
}

Assistant:

uint64_t
internal_rle_compress (
    void* out, uint64_t outbytes, const void* src, uint64_t srcbytes)
{
    int8_t*       cbuf = out;
    const int8_t* runs = src;
    const int8_t* end  = runs + srcbytes;
    const int8_t* rune = runs + 1;
    uint64_t      outb = 0;

    while (runs < end)
    {
        uint8_t curcount = 0;
        while (rune < end && *runs == *rune && curcount < MAX_RUN_LENGTH)
        {
            ++rune;
            ++curcount;
        }

        if (curcount >= (MIN_RUN_LENGTH - 1))
        {
            cbuf[outb++] = (int8_t) curcount;
            cbuf[outb++] = *runs;

            runs = rune;
        }
        else
        {
            /* incompressible */
            ++curcount;
            while (rune < end &&
                   ((rune + 1 >= end || *rune != *(rune + 1)) ||
                    (rune + 2 >= end || *(rune + 1) != *(rune + 2))) &&
                   curcount < MAX_RUN_LENGTH)
            {
                ++curcount;
                ++rune;
            }
            cbuf[outb++] = (int8_t) (-((int) curcount));
            while (runs < rune)
                cbuf[outb++] = *runs++;
        }
        ++rune;
        if (outb >= outbytes) break;
    }
    return outb;
}